

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dma_read.c
# Opt level: O2

int main(int argc,char **argv)

{
  int len;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  nettlp *__buf;
  char *__s;
  size_t count;
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  int local_105c;
  nettlp nt;
  char buf [4096];
  
  nt.remote_addr.s_addr = 0;
  nt.local_addr.s_addr = 0;
  nt.requester = 0;
  nt.tag = '\0';
  nt._11_1_ = 0;
  nt.dir = DMA_ISSUED_BY_LIBTLP;
  nt.sockfd = 0;
  nt.port = 0;
  nt._22_2_ = 0;
  addr = 0;
  busn = 0;
  devn = 0;
  local_105c = 4;
LAB_00102416:
  iVar1 = getopt(argc,argv,"r:l:b:t:a:s:");
  switch(iVar1) {
  case 0x6c:
    __buf = (nettlp *)&nt.local_addr;
    break;
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_00102432_caseD_6d;
  case 0x72:
    __buf = &nt;
    break;
  case 0x73:
    goto switchD_00102432_caseD_73;
  case 0x74:
    iVar1 = atoi(_optarg);
    nt.tag = (uint8_t)iVar1;
    goto LAB_00102416;
  default:
    if (iVar1 == 0x61) {
      __isoc99_sscanf(_optarg,"0x%lx",&addr);
    }
    else {
      if (iVar1 != 0x62) {
        if (iVar1 == -1) {
          iVar1 = nettlp_init(&nt);
          if (iVar1 < 0) {
            __s = "nettlp_init";
          }
          else {
            dump_nettlp(&nt);
            iVar1 = 0;
            memset(buf,0,0x1000);
            len = local_105c;
            count = (size_t)local_105c;
            uVar4 = dma_read(&nt,addr,buf,count);
            uVar2 = tlp_calculate_length(addr,count);
            printf("tlp_length is %u\n",(ulong)uVar2);
            puts("\n");
            printf("dma_read returns %d\n",uVar4 & 0xffffffff);
            putchar(10);
            uVar2 = tlp_calculate_lstdw(addr,count);
            uVar3 = tlp_calculate_fstdw(addr,count);
            printf("Last 0x%x, 1st 0x%x\n",(ulong)uVar2,(ulong)uVar3);
            printf("dma_read returns %d\n",uVar4 & 0xffffffff);
            if (-1 < (int)uVar4) {
              if ((int)uVar4 != 0) {
                hexdump(buf,len);
                return 0;
              }
              return 0;
            }
            __s = "dma_read";
          }
          perror(__s);
          return iVar1;
        }
switchD_00102432_caseD_6d:
        usage();
        return -1;
      }
      __isoc99_sscanf(_optarg,"%hx:%hx",&busn,&devn);
      nt.requester = busn << 8 | devn;
    }
    goto LAB_00102416;
  }
  iVar1 = inet_pton(2,_optarg,__buf);
  if (iVar1 < 1) {
    perror("inet_pton");
    return -1;
  }
  goto LAB_00102416;
switchD_00102432_caseD_73:
  local_105c = atoi(_optarg);
  if (local_105c - 0x1001U < 0xfffff000) {
    fwrite("size must be 0 > | < 4096\n",0x1a,1,_stderr);
    return -1;
  }
  goto LAB_00102416;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	size = 4;
	addr = 0;
	busn = 0;
	devn = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 's':
			size = atoi(optarg);
			if (size < 1 || size > 4096) {
				fprintf(stderr, "size must be 0 > | < 4096\n");
				return -1;
			}
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	memset(buf, 0, sizeof(buf));


	ret = dma_read(&nt, addr, buf, size);

	printf("tlp_length is %u\n", tlp_calculate_length(addr, size));


	printf("\n\n");
	printf("dma_read returns %d\n", ret);
	printf("\n");
	printf("Last 0x%x, 1st 0x%x\n",
	       tlp_calculate_lstdw(addr, size),
	       tlp_calculate_fstdw(addr, size));

	printf("dma_read returns %d\n", ret);
	if (ret < 0)
		perror("dma_read");


	if (ret > 0)
		hexdump(buf, size);


	return 0;
}